

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxbp.cpp
# Opt level: O0

void __thiscall libDAI::BoxBP::calcNewBox(BoxBP *this,FactorGraph *fg,size_t iI)

{
  bool bVar1;
  int iVar2;
  edge_type *peVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference puVar4;
  Box *pBVar5;
  undefined4 extraout_var_02;
  size_type in_RDX;
  FactorGraph *in_RSI;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> *in_RDI;
  nb_cit J;
  Box mjI;
  Var v_j;
  nb_cit j;
  vector<libDAI::Box,_std::allocator<libDAI::Box>_> incoming;
  VarSet v_I;
  Var v_i;
  size_t I;
  size_t i;
  Box *in_stack_fffffffffffffdb8;
  FactorGraph *in_stack_fffffffffffffdc0;
  FactorGraph *in_stack_fffffffffffffdc8;
  Box *in_stack_fffffffffffffdd0;
  FactorGraph *in_stack_fffffffffffffde8;
  nb_type *in_stack_fffffffffffffdf0;
  FactorGraph *ns;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_120 [15];
  pointer local_a8;
  pointer pVStack_a0;
  unsigned_long *local_90;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_78 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  unsigned_long local_28;
  unsigned_long local_20;
  size_type local_18;
  FactorGraph *local_10;
  undefined4 extraout_var_01;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  peVar3 = FactorGraph::edge(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  local_20 = peVar3->first;
  peVar3 = FactorGraph::edge(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  local_28 = peVar3->second;
  iVar2 = (*(local_10->super_GraphicalModel)._vptr_GraphicalModel[6])(local_10,local_20);
  local_38 = *(undefined8 *)CONCAT44(extraout_var,iVar2);
  uStack_30 = ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
  iVar2 = (*(local_10->super_GraphicalModel)._vptr_GraphicalModel[10])(local_10,local_28);
  TFactor<double>::vars((TFactor<double> *)CONCAT44(extraout_var_00,iVar2));
  VarSet::VarSet((VarSet *)in_stack_fffffffffffffdc0,&in_stack_fffffffffffffdb8->_vars);
  std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::vector
            ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)0xb15291);
  FactorGraph::nbF(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  local_78[0]._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdb8
                 );
  while( true ) {
    FactorGraph::nbF(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
    local_90 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdb8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffdc0,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffdb8);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(local_78);
    if (*puVar4 != local_20) {
      ns = local_10;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_78);
      iVar2 = (*(ns->super_GraphicalModel)._vptr_GraphicalModel[6])(ns,*puVar4);
      pBVar5 = (Box *)CONCAT44(extraout_var_01,iVar2);
      local_a8 = (pBVar5->_vars)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pVStack_a0 = (pBVar5->_vars)._vars.
                   super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      VarSet::VarSet(&in_stack_fffffffffffffdd0->_vars,(Var *)in_stack_fffffffffffffdc8);
      Box::Box(pBVar5,(VarSet *)ns,(double)in_stack_fffffffffffffdf0,
               (double)in_stack_fffffffffffffde8);
      VarSet::~VarSet((VarSet *)0xb153b4);
      in_stack_fffffffffffffde8 = local_10;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(local_78);
      in_stack_fffffffffffffdf0 =
           FactorGraph::nbV(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
      local_120[0]._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffdb8);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_78);
        FactorGraph::nbV(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffdb8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffdc0,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffdb8);
        if (!bVar1) break;
        puVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(local_120);
        if (*puVar4 != local_28) {
          in_stack_fffffffffffffdc0 = local_10;
          puVar4 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(local_78);
          in_stack_fffffffffffffdc8 = (FactorGraph *)*puVar4;
          __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(local_120);
          in_stack_fffffffffffffdd0 =
               box((BoxBP *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                   (size_t)in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
          Box::operator*=((Box *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      }
      std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::push_back
                ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)in_stack_fffffffffffffdd0,
                 (value_type *)in_stack_fffffffffffffdc8);
      Box::~Box((Box *)in_stack_fffffffffffffdc0);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffdc8,(int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
  }
  iVar2 = (*(local_10->super_GraphicalModel)._vptr_GraphicalModel[10])(local_10,local_28);
  pBVar5 = (Box *)CONCAT44(extraout_var_02,iVar2);
  TFactor<double>::TFactor
            ((TFactor<double> *)in_stack_fffffffffffffdd0,
             (TFactor<double> *)in_stack_fffffffffffffdc8);
  VarSet::VarSet(&in_stack_fffffffffffffdd0->_vars,(Var *)in_stack_fffffffffffffdc8);
  boundSumProd((Factor *)v_i._states,(vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)v_i._label
               ,(VarSet *)v_I._statespace,
               v_I._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._7_1_,
               v_I._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._6_1_);
  std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::operator[](in_RDI,local_18);
  Box::operator=((Box *)in_stack_fffffffffffffdc0,pBVar5);
  Box::~Box((Box *)in_stack_fffffffffffffdc0);
  VarSet::~VarSet((VarSet *)0xb15646);
  TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffdc0);
  std::vector<libDAI::Box,_std::allocator<libDAI::Box>_>::~vector
            ((vector<libDAI::Box,_std::allocator<libDAI::Box>_> *)in_stack_fffffffffffffdd0);
  VarSet::~VarSet((VarSet *)0xb1566d);
  return;
}

Assistant:

void BoxBP::calcNewBox( const FactorGraph &fg, size_t iI ) {
        size_t i = fg.edge(iI).first;
        size_t I = fg.edge(iI).second;
        Var v_i = fg.var(i);
        VarSet v_I = fg.factor(I).vars();

        vector<Box> incoming;
        for( FactorGraph::nb_cit j = fg.nbF(I).begin(); j != fg.nbF(I).end(); j++ )
            if( *j != i ) {
                Var v_j = fg.var(*j);
                Box mjI( v_j, 1.0, 1.0 );
                for( FactorGraph::nb_cit J = fg.nbV(*j).begin(); J != fg.nbV(*j).end(); J++ ) 
                    if( *J != I )
                        mjI *= box( fg, *j, *J );
                incoming.push_back( mjI );
            }
        _boxes[iI] = boundSumProd( fg.factor(I), incoming, v_i, true, true );
    }